

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcomp.c
# Opt level: O1

int obmc_diamond_search_sad
              (FULLPEL_MOTION_SEARCH_PARAMS *ms_params,FULLPEL_MV start_mv,FULLPEL_MV *best_mv,
              int search_step,int *num00)

{
  byte bVar1;
  int iVar2;
  FULLPEL_MV FVar3;
  aom_variance_fn_ptr_t *paVar4;
  buf_2d *pbVar5;
  search_site_config *psVar6;
  int32_t *piVar7;
  int32_t *piVar8;
  short sVar9;
  short sVar10;
  int iVar11;
  uint uVar12;
  uint8_t *puVar13;
  long lVar14;
  int *piVar15;
  int iVar16;
  uint8_t *puVar17;
  uint uVar18;
  int iVar19;
  ushort uVar20;
  ulong uVar21;
  undefined1 auVar22 [16];
  short sVar23;
  short sVar25;
  FULLPEL_MV FVar24;
  
  paVar4 = ms_params->vfp;
  pbVar5 = (ms_params->ms_buffers).ref;
  psVar6 = ms_params->search_sites;
  piVar7 = (ms_params->ms_buffers).wsrc;
  piVar8 = (ms_params->ms_buffers).obmc_mask;
  iVar11 = (int)start_mv.row;
  iVar16 = (int)start_mv >> 0x10;
  iVar19 = (ms_params->mv_limits).col_max;
  if (iVar16 < iVar19) {
    iVar19 = iVar16;
  }
  iVar2 = (ms_params->mv_limits).col_min;
  if (iVar16 < iVar2) {
    iVar19 = iVar2;
  }
  iVar16 = (ms_params->mv_limits).row_max;
  if (iVar11 < iVar16) {
    iVar16 = iVar11;
  }
  uVar20 = (ushort)iVar16;
  iVar16 = (ms_params->mv_limits).row_min;
  if (iVar11 < iVar16) {
    uVar20 = (ushort)iVar16;
  }
  iVar11 = psVar6->num_search_steps;
  puVar17 = pbVar5->buf + ((int)(short)iVar19 + pbVar5->stride * (int)(short)uVar20);
  *num00 = 0;
  *best_mv = (FULLPEL_MV)((uint)uVar20 | iVar19 << 0x10);
  uVar12 = (*paVar4->osdf)(puVar17,pbVar5->stride,piVar7,piVar8);
  bVar1 = (ms_params->mv_cost_params).mv_cost_type;
  if (bVar1 < 4) {
    FVar3 = (ms_params->mv_cost_params).full_ref_mv;
    auVar22 = psllw(ZEXT416(CONCAT22((*best_mv).col - FVar3.col,(*best_mv).row - FVar3.row)),3);
    sVar23 = auVar22._0_2_;
    sVar25 = auVar22._2_2_;
    switch(bVar1) {
    case 0:
      uVar18 = ((ms_params->mv_cost_params).mvcost[0][sVar23] +
                *(int *)((long)(ms_params->mv_cost_params).mvjcost +
                        (ulong)((uint)(sVar25 != 0) * 4 + (uint)(sVar23 != 0) * 8)) +
               (ms_params->mv_cost_params).mvcost[1][sVar25]) *
               (ms_params->mv_cost_params).sad_per_bit + 0x100U >> 9;
      break;
    case 1:
      sVar9 = -sVar23;
      sVar10 = -sVar25;
      uVar18 = ((uint)(ushort)((ushort)(sVar10 < sVar25) * sVar25 |
                              (ushort)(sVar10 >= sVar25) * sVar10) +
               (uint)(ushort)((ushort)(sVar9 < sVar23) * sVar23 | (ushort)(sVar9 >= sVar23) * sVar9)
               ) * 4;
      break;
    case 2:
      sVar9 = -sVar23;
      sVar10 = -sVar25;
      uVar18 = ((uint)(ushort)((ushort)(sVar10 < sVar25) * sVar25 |
                              (ushort)(sVar10 >= sVar25) * sVar10) +
               (uint)(ushort)((ushort)(sVar9 < sVar23) * sVar23 | (ushort)(sVar9 >= sVar23) * sVar9)
               ) * 0xf >> 3;
      break;
    case 3:
      sVar9 = -sVar23;
      sVar10 = -sVar25;
      uVar18 = (uint)(ushort)((ushort)(sVar10 < sVar25) * sVar25 |
                             (ushort)(sVar10 >= sVar25) * sVar10) +
               (uint)(ushort)((ushort)(sVar9 < sVar23) * sVar23 | (ushort)(sVar9 >= sVar23) * sVar9)
      ;
    }
  }
  else {
    uVar18 = 0;
  }
  iVar19 = uVar18 + uVar12;
  uVar12 = iVar11 + ~search_step;
  if (-1 < (int)uVar12) {
    piVar15 = &psVar6->site[uVar12][1].offset;
    puVar13 = puVar17;
    uVar21 = (ulong)uVar12;
    do {
      if (psVar6->searches_per_step[uVar21] < 1) {
        iVar11 = 0;
      }
      else {
        lVar14 = 0;
        iVar11 = 0;
        do {
          sVar23 = (short)piVar15[lVar14 * 2 + -1] + (*best_mv).row;
          sVar25 = (short)((uint)piVar15[lVar14 * 2 + -1] >> 0x10) + (*best_mv).col;
          if (((((ms_params->mv_limits).col_min <= (int)sVar25) &&
               ((int)sVar25 <= (ms_params->mv_limits).col_max)) &&
              ((ms_params->mv_limits).row_min <= (int)sVar23)) &&
             (((int)sVar23 <= (ms_params->mv_limits).row_max &&
              (uVar12 = (*paVar4->osdf)(puVar13 + piVar15[lVar14 * 2],pbVar5->stride,piVar7,piVar8),
              (int)uVar12 < iVar19)))) {
            bVar1 = (ms_params->mv_cost_params).mv_cost_type;
            if (bVar1 < 4) {
              FVar3 = (ms_params->mv_cost_params).full_ref_mv;
              auVar22 = psllw(ZEXT416(CONCAT22(sVar25 - FVar3.col,sVar23 - FVar3.row)),3);
              sVar23 = auVar22._0_2_;
              sVar25 = auVar22._2_2_;
              switch(bVar1) {
              case 0:
                uVar18 = ((ms_params->mv_cost_params).mvcost[0][sVar23] +
                          *(int *)((long)(ms_params->mv_cost_params).mvjcost +
                                  (ulong)((uint)(sVar25 != 0) * 4 + (uint)(sVar23 != 0) * 8)) +
                         (ms_params->mv_cost_params).mvcost[1][sVar25]) *
                         (ms_params->mv_cost_params).sad_per_bit + 0x100U >> 9;
                break;
              case 1:
                sVar9 = -sVar23;
                sVar10 = -sVar25;
                uVar18 = ((uint)(ushort)((ushort)(sVar10 < sVar25) * sVar25 |
                                        (ushort)(sVar10 >= sVar25) * sVar10) +
                         (uint)(ushort)((ushort)(sVar9 < sVar23) * sVar23 |
                                       (ushort)(sVar9 >= sVar23) * sVar9)) * 4;
                break;
              case 2:
                sVar9 = -sVar23;
                sVar10 = -sVar25;
                uVar18 = ((uint)(ushort)((ushort)(sVar10 < sVar25) * sVar25 |
                                        (ushort)(sVar10 >= sVar25) * sVar10) +
                         (uint)(ushort)((ushort)(sVar9 < sVar23) * sVar23 |
                                       (ushort)(sVar9 >= sVar23) * sVar9)) * 0xf >> 3;
                break;
              case 3:
                sVar9 = -sVar23;
                sVar10 = -sVar25;
                uVar18 = (uint)(ushort)((ushort)(sVar10 < sVar25) * sVar25 |
                                       (ushort)(sVar10 >= sVar25) * sVar10) +
                         (uint)(ushort)((ushort)(sVar9 < sVar23) * sVar23 |
                                       (ushort)(sVar9 >= sVar23) * sVar9);
              }
            }
            else {
              uVar18 = 0;
            }
            if ((int)(uVar18 + uVar12) < iVar19) {
              iVar19 = uVar18 + uVar12;
              iVar11 = (int)lVar14 + 1;
            }
          }
          lVar14 = lVar14 + 1;
        } while (lVar14 < psVar6->searches_per_step[uVar21]);
      }
      if (iVar11 == 0) {
        if (puVar13 == puVar17) {
          *num00 = *num00 + 1;
        }
      }
      else {
        FVar3 = psVar6->site[uVar21][iVar11].mv;
        FVar24.row = (*best_mv).row + FVar3.row;
        FVar24.col = (*best_mv).col + FVar3.col;
        *best_mv = FVar24;
        puVar13 = puVar13 + psVar6->site[uVar21][iVar11].offset;
      }
      piVar15 = piVar15 + -0x22;
      iVar11 = (int)uVar21;
      uVar21 = uVar21 - 1;
    } while (0 < iVar11);
  }
  return iVar19;
}

Assistant:

static int obmc_diamond_search_sad(
    const FULLPEL_MOTION_SEARCH_PARAMS *ms_params, FULLPEL_MV start_mv,
    FULLPEL_MV *best_mv, int search_step, int *num00) {
  const aom_variance_fn_ptr_t *fn_ptr = ms_params->vfp;
  const search_site_config *cfg = ms_params->search_sites;
  const MV_COST_PARAMS *mv_cost_params = &ms_params->mv_cost_params;
  const MSBuffers *ms_buffers = &ms_params->ms_buffers;
  const int32_t *wsrc = ms_buffers->wsrc;
  const int32_t *mask = ms_buffers->obmc_mask;
  const struct buf_2d *const ref_buf = ms_buffers->ref;

  // search_step determines the length of the initial step and hence the number
  // of iterations.
  const int tot_steps = cfg->num_search_steps - search_step;
  const uint8_t *best_address, *init_ref;
  int best_sad = INT_MAX;
  int best_site = 0;

  clamp_fullmv(&start_mv, &ms_params->mv_limits);
  best_address = init_ref = get_buf_from_fullmv(ref_buf, &start_mv);
  *num00 = 0;
  *best_mv = start_mv;

  // Check the starting position
  best_sad = fn_ptr->osdf(best_address, ref_buf->stride, wsrc, mask) +
             mvsad_err_cost_(best_mv, mv_cost_params);

  for (int step = tot_steps - 1; step >= 0; --step) {
    const search_site *const site = cfg->site[step];
    best_site = 0;
    for (int idx = 1; idx <= cfg->searches_per_step[step]; ++idx) {
      const FULLPEL_MV mv = { best_mv->row + site[idx].mv.row,
                              best_mv->col + site[idx].mv.col };
      if (av1_is_fullmv_in_range(&ms_params->mv_limits, mv)) {
        int sad = fn_ptr->osdf(best_address + site[idx].offset, ref_buf->stride,
                               wsrc, mask);
        if (sad < best_sad) {
          sad += mvsad_err_cost_(&mv, mv_cost_params);

          if (sad < best_sad) {
            best_sad = sad;
            best_site = idx;
          }
        }
      }
    }

    if (best_site != 0) {
      best_mv->row += site[best_site].mv.row;
      best_mv->col += site[best_site].mv.col;
      best_address += site[best_site].offset;
    } else if (best_address == init_ref) {
      (*num00)++;
    }
  }
  return best_sad;
}